

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getStencilStateSetName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          VkStencilOpState *stencilOpStateFront,VkStencilOpState *stencilOpStateBack)

{
  ostream *poVar1;
  string *psVar2;
  VkStencilOpState *stencilOpState;
  VkStencilOpState *stencilOpState_00;
  ostringstream name;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"front_",6);
  getStencilName_abi_cxx11_(&local_1b8,this,stencilOpState);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_back_",6);
  getStencilName_abi_cxx11_
            (&local_1d8,(_anonymous_namespace_ *)stencilOpStateFront,stencilOpState_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  psVar2 = (string *)std::ios_base::~ios_base(local_128);
  return psVar2;
}

Assistant:

std::string getStencilStateSetName(const VkStencilOpState& stencilOpStateFront,
								   const VkStencilOpState& stencilOpStateBack)
{
	std::ostringstream name;

	name << "front_" << getStencilName(stencilOpStateFront)
		 << "_back_" << getStencilName(stencilOpStateBack);

	return name.str();
}